

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O2

int __thiscall ReadData::ResetObs(ReadData *this)

{
  undefined8 *puVar1;
  long lVar2;
  
  for (lVar2 = 0x18; lVar2 != 0x1c18; lVar2 = lVar2 + 0x70) {
    *(undefined8 *)(&this->field_0x0 + lVar2) = 0xbff0000000000000;
    *(undefined4 *)((long)this + lVar2 + -0x18) = 0;
    puVar1 = (undefined8 *)((long)this + lVar2 + -0x10);
    *puVar1 = 0xbff0000000000000;
    puVar1[1] = 0xbff0000000000000;
  }
  for (lVar2 = 0; lVar2 != 0xe00; lVar2 = lVar2 + 0x70) {
    *(undefined8 *)(&this->field_0x1c18 + lVar2) = 0xbff0000000000000;
    *(undefined4 *)(&this->field_0x1c00 + lVar2) = 0;
    *(undefined8 *)(&this->field_0x1c08 + lVar2) = 0xbff0000000000000;
    *(undefined8 *)((long)(&this->field_0x1c08 + lVar2) + 8) = 0xbff0000000000000;
  }
  return 0;
}

Assistant:

int ReadData::ResetObs() {
    for(int i = 0; i < MAXBDSSRN; ++i) {
        this->BDSObs[i].psr[0] = -1;
        this->BDSObs[i].psr[1] = -1;
        this->BDSObs[i].ObsTime.Week = 0;
        this->BDSObs[i].ObsTime.SOW = -1;
    }
    for(int i = 0; i < MAXGPSSRN; ++i) {
        this->GPSObs[i].psr[0] = -1;
        this->GPSObs[i].psr[1] = -1;
        this->GPSObs[i].ObsTime.Week = 0;
        this->GPSObs[i].ObsTime.SOW = -1;
    }
    return 0;
}